

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

Color * __thiscall Color::confine(Color *this)

{
  Color *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = 1.0;
  if (this->r <= 1.0) {
    dVar1 = this->r;
  }
  dVar3 = 0.0;
  if (0.0 <= dVar1) {
    dVar3 = dVar1;
  }
  dVar1 = 1.0;
  if (this->g <= 1.0) {
    dVar1 = this->g;
  }
  dVar4 = 0.0;
  if (0.0 <= dVar1) {
    dVar4 = dVar1;
  }
  dVar1 = 1.0;
  if (this->b <= 1.0) {
    dVar1 = this->b;
  }
  dVar2 = 0.0;
  if (0.0 <= dVar1) {
    dVar2 = dVar1;
  }
  in_RDI->r = dVar3;
  in_RDI->g = dVar4;
  in_RDI->b = dVar2;
  return in_RDI;
}

Assistant:

Color Color::confine() const
{
    return Color(std::max(std::min(r, 1.0), 0.0), std::max(std::min(g, 1.0), 0.0), std::max(std::min(b, 1.0), 0.0));
}